

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry.cpp
# Opt level: O0

Status __thiscall
ot::commissioner::persistent_storage::Registry::GetNetworksByAliases
          (Registry *this,StringArray *aAliases,NetworkArray *aRet,StringArray *aUnresolved)

{
  bool bVar1;
  __type_conflict1 _Var2;
  size_type sVar3;
  reference __lhs;
  char *pcVar4;
  iterator iVar5;
  iterator iVar6;
  __normal_iterator<ot::commissioner::persistent_storage::Network_*,_std::vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>_>
  local_388;
  const_iterator local_380;
  Network *local_378;
  __normal_iterator<ot::commissioner::persistent_storage::Network_*,_std::vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>_>
  local_370;
  const_iterator local_368;
  const_iterator local_360;
  Network *local_350;
  Network *local_348;
  __normal_iterator<ot::commissioner::persistent_storage::Network_*,_std::vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>_>
  local_340;
  __normal_iterator<ot::commissioner::persistent_storage::Network_*,_std::vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>_>
  last;
  Error local_320;
  Error local_2f8;
  allocator local_2c9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  undefined1 local_2a8 [8];
  string aliasAsPanId;
  string local_268;
  undefined1 local_241;
  undefined1 local_240 [7];
  bool hasHexPrefix;
  Error local_218;
  unsigned_short local_1ea;
  uint64_t uStack_1e8;
  uint16_t pid;
  uint64_t xpid;
  Network nwk;
  Network nwkThis_1;
  const_iterator local_118;
  __normal_iterator<ot::commissioner::persistent_storage::Network_*,_std::vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>_>
  local_110;
  Network *local_108;
  Network *local_100;
  __normal_iterator<ot::commissioner::persistent_storage::Network_*,_std::vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>_>
  local_f8;
  __normal_iterator<ot::commissioner::persistent_storage::Network_*,_std::vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>_>
  local_f0;
  __normal_iterator<ot::commissioner::persistent_storage::Network_*,_std::vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>_>
  nwkIter;
  Network nwkThis;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *alias;
  const_iterator __end2;
  const_iterator __begin2;
  StringArray *__range2;
  undefined1 local_50 [8];
  NetworkArray networks;
  Status status;
  StringArray *aUnresolved_local;
  NetworkArray *aRet_local;
  StringArray *aAliases_local;
  Registry *this_local;
  
  std::
  vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
  ::vector((vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
            *)local_50);
  sVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(aAliases);
  if (sVar3 == 0) {
    this_local._7_1_ = kError;
  }
  else {
    __end2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(aAliases);
    alias = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::end(aAliases);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&alias), bVar1) {
      __lhs = __gnu_cxx::
              __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator*(&__end2);
      _Var2 = std::operator==(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)(anonymous_namespace)::ALIAS_ALL_abi_cxx11_);
      if ((_Var2) ||
         (_Var2 = std::operator==(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)(anonymous_namespace)::ALIAS_OTHER_abi_cxx11_), _Var2)) {
        sVar3 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(aAliases);
        if (sVar3 != 1) {
          networks.
          super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = kError;
          goto LAB_0021696f;
        }
        networks.
        super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ =
             GetAllNetworks(this,(NetworkArray *)local_50);
        if (networks.
            super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ != kSuccess) goto LAB_0021696f;
        _Var2 = std::operator==(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)(anonymous_namespace)::ALIAS_OTHER_abi_cxx11_);
        if (_Var2) {
          Network::Network((Network *)&nwkIter);
          networks.
          super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ =
               GetCurrentNetwork(this,(Network *)&nwkIter);
          if (networks.
              super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ == kSuccess) {
            local_f8._M_current =
                 (Network *)
                 std::
                 vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                 ::begin((vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                          *)local_50);
            local_100 = (Network *)
                        std::
                        vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                        ::end((vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                               *)local_50);
            local_108 = (Network *)&nwkIter;
            local_f0 = std::
                       find_if<__gnu_cxx::__normal_iterator<ot::commissioner::persistent_storage::Network*,std::vector<ot::commissioner::persistent_storage::Network,std::allocator<ot::commissioner::persistent_storage::Network>>>,ot::commissioner::persistent_storage::Registry::GetNetworksByAliases(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::vector<ot::commissioner::persistent_storage::Network,std::allocator<ot::commissioner::persistent_storage::Network>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::__0>
                                 (local_f8,(__normal_iterator<ot::commissioner::persistent_storage::Network_*,_std::vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>_>
                                            )local_100,
                                  (anon_class_8_1_0f63f060_for__M_pred)local_108);
            local_110._M_current =
                 (Network *)
                 std::
                 vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                 ::end((vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                        *)local_50);
            bVar1 = __gnu_cxx::operator!=(&local_f0,&local_110);
            if (bVar1) {
              __gnu_cxx::
              __normal_iterator<ot::commissioner::persistent_storage::Network_const*,std::vector<ot::commissioner::persistent_storage::Network,std::allocator<ot::commissioner::persistent_storage::Network>>>
              ::__normal_iterator<ot::commissioner::persistent_storage::Network*>
                        ((__normal_iterator<ot::commissioner::persistent_storage::Network_const*,std::vector<ot::commissioner::persistent_storage::Network,std::allocator<ot::commissioner::persistent_storage::Network>>>
                          *)&local_118,&local_f0);
              std::
              vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
              ::erase((vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                       *)local_50,local_118);
            }
            __range2._4_4_ = 0;
          }
          else {
            __range2._4_4_ = 6;
          }
          Network::~Network((Network *)&nwkIter);
          if (__range2._4_4_ != 0) {
            if (__range2._4_4_ != 6) goto LAB_0021697c;
            goto LAB_0021696f;
          }
        }
      }
      else {
        _Var2 = std::operator==(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)(anonymous_namespace)::ALIAS_THIS_abi_cxx11_);
        if (_Var2) {
          Network::Network((Network *)&nwk.mCcm);
          networks.
          super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ =
               GetCurrentNetwork(this,(Network *)&nwk.mCcm);
          if ((networks.
               super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ == kSuccess) &&
             (nwk.mCcm != -1)) {
            std::
            vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
            ::push_back((vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                         *)local_50,(value_type *)&nwk.mCcm);
          }
          else {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(aUnresolved,__lhs);
          }
          Network::~Network((Network *)&nwk.mCcm);
        }
        else {
          Network::Network((Network *)&xpid);
          networks.
          super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = kNotFound;
          utils::ParseInteger<unsigned_long>(&local_218,&stack0xfffffffffffffe18,__lhs);
          Error::Error((Error *)local_240);
          bVar1 = Error::operator==(&local_218,(Error *)local_240);
          Error::~Error((Error *)local_240);
          Error::~Error(&local_218);
          if (bVar1) {
            networks.
            super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ =
                 GetNetworkByXpan(this,uStack_1e8,(Network *)&xpid);
          }
          if (networks.
              super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ != kSuccess) {
            networks.
            super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ =
                 GetNetworkByName(this,__lhs,(Network *)&xpid);
          }
          if (networks.
              super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ != kSuccess) {
            std::__cxx11::string::substr((ulong)((long)&aliasAsPanId.field_2 + 8),(ulong)__lhs);
            utils::ToLower(&local_268,(string *)((long)&aliasAsPanId.field_2 + 8));
            bVar1 = std::operator!=(&local_268,"0x");
            std::__cxx11::string::~string((string *)&local_268);
            std::__cxx11::string::~string((string *)(aliasAsPanId.field_2._M_local_buf + 8));
            pcVar4 = anon_var_dwarf_3ea58f + 9;
            if (bVar1) {
              pcVar4 = "0x";
            }
            local_241 = bVar1;
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_2c8,pcVar4,&local_2c9);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_2a8,&local_2c8,__lhs);
            std::__cxx11::string::~string((string *)&local_2c8);
            std::allocator<char>::~allocator((allocator<char> *)&local_2c9);
            utils::ParseInteger<unsigned_short>(&local_2f8,&local_1ea,(string *)local_2a8);
            Error::Error(&local_320);
            bVar1 = Error::operator==(&local_2f8,&local_320);
            Error::~Error(&local_320);
            Error::~Error(&local_2f8);
            if (bVar1) {
              networks.
              super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ =
                   GetNetworkByPan(this,(string *)local_2a8,(Network *)&xpid);
            }
            std::__cxx11::string::~string((string *)local_2a8);
          }
          if (networks.
              super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ == kSuccess) {
            std::
            vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
            ::push_back((vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                         *)local_50,(value_type *)&xpid);
          }
          else {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(aUnresolved,__lhs);
          }
          Network::~Network((Network *)&xpid);
        }
      }
      iVar5 = std::
              vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
              ::begin((vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                       *)local_50);
      iVar6 = std::
              vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
              ::end((vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                     *)local_50);
      std::
      sort<__gnu_cxx::__normal_iterator<ot::commissioner::persistent_storage::Network*,std::vector<ot::commissioner::persistent_storage::Network,std::allocator<ot::commissioner::persistent_storage::Network>>>,ot::commissioner::persistent_storage::Registry::GetNetworksByAliases(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::vector<ot::commissioner::persistent_storage::Network,std::allocator<ot::commissioner::persistent_storage::Network>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::__1>
                (iVar5._M_current,iVar6._M_current);
      local_348 = (Network *)
                  std::
                  vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                  ::begin((vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                           *)local_50);
      local_350 = (Network *)
                  std::
                  vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                  ::end((vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                         *)local_50);
      local_340 = std::
                  unique<__gnu_cxx::__normal_iterator<ot::commissioner::persistent_storage::Network*,std::vector<ot::commissioner::persistent_storage::Network,std::allocator<ot::commissioner::persistent_storage::Network>>>,ot::commissioner::persistent_storage::Registry::GetNetworksByAliases(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::vector<ot::commissioner::persistent_storage::Network,std::allocator<ot::commissioner::persistent_storage::Network>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::__2>
                            (local_348,local_350);
      __gnu_cxx::
      __normal_iterator<ot::commissioner::persistent_storage::Network_const*,std::vector<ot::commissioner::persistent_storage::Network,std::allocator<ot::commissioner::persistent_storage::Network>>>
      ::__normal_iterator<ot::commissioner::persistent_storage::Network*>
                ((__normal_iterator<ot::commissioner::persistent_storage::Network_const*,std::vector<ot::commissioner::persistent_storage::Network,std::allocator<ot::commissioner::persistent_storage::Network>>>
                  *)&local_360,&local_340);
      local_370._M_current =
           (Network *)
           std::
           vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
           ::end((vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                  *)local_50);
      __gnu_cxx::
      __normal_iterator<ot::commissioner::persistent_storage::Network_const*,std::vector<ot::commissioner::persistent_storage::Network,std::allocator<ot::commissioner::persistent_storage::Network>>>
      ::__normal_iterator<ot::commissioner::persistent_storage::Network*>
                ((__normal_iterator<ot::commissioner::persistent_storage::Network_const*,std::vector<ot::commissioner::persistent_storage::Network,std::allocator<ot::commissioner::persistent_storage::Network>>>
                  *)&local_368,&local_370);
      local_378 = (Network *)
                  std::
                  vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                  ::erase((vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                           *)local_50,local_360,local_368);
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2);
    }
    local_388._M_current =
         (Network *)
         std::
         vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
         ::end(aRet);
    __gnu_cxx::
    __normal_iterator<ot::commissioner::persistent_storage::Network_const*,std::vector<ot::commissioner::persistent_storage::Network,std::allocator<ot::commissioner::persistent_storage::Network>>>
    ::__normal_iterator<ot::commissioner::persistent_storage::Network*>
              ((__normal_iterator<ot::commissioner::persistent_storage::Network_const*,std::vector<ot::commissioner::persistent_storage::Network,std::allocator<ot::commissioner::persistent_storage::Network>>>
                *)&local_380,&local_388);
    iVar5 = std::
            vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
            ::begin((vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                     *)local_50);
    iVar6 = std::
            vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
            ::end((vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                   *)local_50);
    std::
    vector<ot::commissioner::persistent_storage::Network,std::allocator<ot::commissioner::persistent_storage::Network>>
    ::
    insert<__gnu_cxx::__normal_iterator<ot::commissioner::persistent_storage::Network*,std::vector<ot::commissioner::persistent_storage::Network,std::allocator<ot::commissioner::persistent_storage::Network>>>,void>
              ((vector<ot::commissioner::persistent_storage::Network,std::allocator<ot::commissioner::persistent_storage::Network>>
                *)aRet,local_380,
               (__normal_iterator<ot::commissioner::persistent_storage::Network_*,_std::vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>_>
                )iVar5._M_current,
               (__normal_iterator<ot::commissioner::persistent_storage::Network_*,_std::vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>_>
                )iVar6._M_current);
    sVar3 = std::
            vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
            ::size((vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                    *)local_50);
    if (sVar3 != 0) {
      networks.
      super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = kSuccess;
    }
LAB_0021696f:
    this_local._7_1_ =
         networks.
         super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_;
  }
LAB_0021697c:
  std::
  vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
  ::~vector((vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
             *)local_50);
  return this_local._7_1_;
}

Assistant:

Registry::Status Registry::GetNetworksByAliases(const StringArray &aAliases,
                                                NetworkArray      &aRet,
                                                StringArray       &aUnresolved)
{
    Registry::Status status;
    NetworkArray     networks;

    if (aAliases.size() == 0)
        return Registry::Status::kError;

    for (const auto &alias : aAliases)
    {
        if (alias == ALIAS_ALL || alias == ALIAS_OTHER)
        {
            VerifyOrExit(aAliases.size() == 1,
                         status = Registry::Status::kError); // Interpreter must have taken care of this
            VerifyOrExit((status = GetAllNetworks(networks)) == Registry::Status::kSuccess);
            if (alias == ALIAS_OTHER)
            {
                Network nwkThis;
                VerifyOrExit((status = GetCurrentNetwork(nwkThis)) == Registry::Status::kSuccess);
                auto nwkIter = find_if(networks.begin(), networks.end(),
                                       [&nwkThis](const Network &el) { return nwkThis.mId.mId == el.mId.mId; });
                if (nwkIter != networks.end())
                {
                    networks.erase(nwkIter);
                }
            }
        }
        else if (alias == ALIAS_THIS)
        {
            // Get selected nwk xpan (no selected is an error)
            Network nwkThis;
            status = GetCurrentNetwork(nwkThis);
            if (status == Registry::Status::kSuccess && nwkThis.mId.mId != EMPTY_ID)
            {
                // Put nwk into networks
                networks.push_back(nwkThis);
            }
            else // failed 'this' must not break the translation flow
            {
                aUnresolved.push_back(alias);
            }
        }
        else
        {
            Network  nwk;
            uint64_t xpid;
            uint16_t pid;

            status = Registry::Status::kNotFound;
            if (utils::ParseInteger(xpid, alias) == ERROR_NONE)
            {
                status = GetNetworkByXpan(xpid, nwk);
            }

            if (status != Registry::Status::kSuccess)
            {
                status = GetNetworkByName(alias, nwk);
            }

            if (status != Registry::Status::kSuccess)
            {
                bool        hasHexPrefix = utils::ToLower(alias.substr(0, 2)) != "0x";
                std::string aliasAsPanId = std::string(hasHexPrefix ? "0x" : "") + alias;

                if (utils::ParseInteger(pid, aliasAsPanId) == ERROR_NONE)
                {
                    status = GetNetworkByPan(aliasAsPanId, nwk);
                }
            }

            if (status == Registry::Status::kSuccess)
            {
                networks.push_back(nwk);
            }
            else // aUnresolved alias must not break processing
            {
                aUnresolved.push_back(alias);
            }
        }

        // Make results unique
        std::sort(networks.begin(), networks.end(),
                  [](Network const &a, Network const &b) { return a.mXpan < b.mXpan; });
        auto last = std::unique(networks.begin(), networks.end(),
                                [](Network const &a, Network const &b) { return a.mXpan == b.mXpan; });
        networks.erase(last, networks.end());
    }

    aRet.insert(aRet.end(), networks.begin(), networks.end());
    if (networks.size() > 0)
    {
        status = Registry::Status::kSuccess;
    }
exit:
    return status;
}